

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::GRULayerParams::Clear(GRULayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  undefined8 *puVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->updategateweightmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->resetgateweightmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->outputgateweightmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->updategaterecursionmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->resetgaterecursionmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->outputgaterecursionmatrix_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->updategatebiasvector_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->updategatebiasvector_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->resetgatebiasvector_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if ((puVar3 == (undefined8 *)0x0) &&
     (pWVar2 = this->outputgatebiasvector_, pWVar2 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar2);
    operator_delete(pWVar2,0x48);
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 3) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 3) = 0;
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  this->inputvectorsize_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GRULayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GRULayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  activations_.Clear();
  if (GetArenaForAllocation() == nullptr && updategateweightmatrix_ != nullptr) {
    delete updategateweightmatrix_;
  }
  updategateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgateweightmatrix_ != nullptr) {
    delete resetgateweightmatrix_;
  }
  resetgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgateweightmatrix_ != nullptr) {
    delete outputgateweightmatrix_;
  }
  outputgateweightmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategaterecursionmatrix_ != nullptr) {
    delete updategaterecursionmatrix_;
  }
  updategaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgaterecursionmatrix_ != nullptr) {
    delete resetgaterecursionmatrix_;
  }
  resetgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgaterecursionmatrix_ != nullptr) {
    delete outputgaterecursionmatrix_;
  }
  outputgaterecursionmatrix_ = nullptr;
  if (GetArenaForAllocation() == nullptr && updategatebiasvector_ != nullptr) {
    delete updategatebiasvector_;
  }
  updategatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && resetgatebiasvector_ != nullptr) {
    delete resetgatebiasvector_;
  }
  resetgatebiasvector_ = nullptr;
  if (GetArenaForAllocation() == nullptr && outputgatebiasvector_ != nullptr) {
    delete outputgatebiasvector_;
  }
  outputgatebiasvector_ = nullptr;
  ::memset(&inputvectorsize_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&reverseinput_) -
      reinterpret_cast<char*>(&inputvectorsize_)) + sizeof(reverseinput_));
  _internal_metadata_.Clear<std::string>();
}